

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

CaseInvariantPropertyListWithHashCode ** __thiscall
JsUtil::
BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::LookupWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  bool bVar2;
  hash_t hVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar1 = *(long *)this;
  uVar4 = 0;
  if (lVar1 != 0) {
    hVar3 = NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::GetHashCode(key);
    uVar4 = BaseDictionary<Js::CaseInvariantPropertyListWithHashCode_*,_Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(hVar3 * 2 + 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar5 = *(uint *)(lVar1 + (ulong)uVar4 * 4);
    uVar4 = 0;
    if (-1 < (int)uVar5) {
      lVar1 = *(long *)(this + 8);
      uVar4 = 0;
      do {
        uVar6 = (ulong)uVar5;
        bVar2 = NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode_*>::Equals
                          (*(CaseInvariantPropertyListWithHashCode **)(lVar1 + 0x10 + uVar6 * 0x18),
                           key);
        if (bVar2) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar4);
          }
          return (CaseInvariantPropertyListWithHashCode **)(uVar6 * 0x18 + *(long *)(this + 8));
        }
        uVar4 = uVar4 + 1;
        uVar5 = *(uint *)(uVar6 * 0x18 + lVar1 + 8);
      } while (-1 < (int)uVar5);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar4);
  }
  return &BaseHashSet<Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::CaseInvariantPropertyListWithHashCode_*,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::LookupWithKey<JsUtil::CharacterBuffer<char16_t>_>::nullElement;
}

Assistant:

TElement const& LookupWithKey(KeyType const& key)
        {
            static const TElement nullElement = nullptr;

            return __super::LookupWithKey(key, nullElement);
        }